

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O1

void duckdb::ListStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  BaseStatistics *this;
  Vector *vector_00;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  long lVar7;
  SelectionVector list_sel;
  UnifiedVectorFormat vdata;
  SelectionVector local_90;
  UnifiedVectorFormat local_78;
  
  this = GetChildStats(stats);
  vector_00 = ListVector::GetEntry(vector);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  if (count == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)sel->sel_vector[iVar4];
      }
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)(local_78.sel)->sel_vector[iVar5];
      }
      lVar7 = *(long *)(local_78.data + iVar5 * 0x10 + 8);
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)) && (lVar7 != 0)) {
        iVar3 = iVar3 + lVar7 + (ulong)(lVar7 == 0);
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  SelectionVector::SelectionVector(&local_90,iVar3);
  if (count == 0) {
    iVar3 = 0;
  }
  else {
    psVar1 = sel->sel_vector;
    psVar2 = (local_78.sel)->sel_vector;
    iVar4 = 0;
    iVar3 = 0;
    do {
      iVar5 = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar1[iVar4];
      }
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[iVar5];
      }
      uVar6 = *(ulong *)(local_78.data + iVar5 * 0x10);
      lVar7 = *(long *)(local_78.data + iVar5 * 0x10 + 8);
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6]
            >> (iVar5 & 0x3f) & 1) != 0)) && (lVar7 != 0)) {
        lVar7 = lVar7 + (ulong)(lVar7 == 0);
        do {
          local_90.sel_vector[iVar3] = (sel_t)uVar6;
          iVar3 = iVar3 + 1;
          uVar6 = (ulong)((sel_t)uVar6 + 1);
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != count);
  }
  BaseStatistics::Verify(this,vector_00,&local_90,iVar3);
  if (local_90.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ListStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &child_stats = ListStats::GetChildStats(stats);
	auto &child_entry = ListVector::GetEntry(vector);
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
	idx_t total_list_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto list = list_data[index];
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
				total_list_count++;
			}
		}
	}
	SelectionVector list_sel(total_list_count);
	idx_t list_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto list = list_data[index];
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
				list_sel.set_index(list_count++, list.offset + list_idx);
			}
		}
	}

	child_stats.Verify(child_entry, list_sel, list_count);
}